

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void av1_highbd_inv_txfm_add_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  byte bVar1;
  transform_1d_sse4_1 p_Var2;
  transform_1d_sse4_1 p_Var3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  int8_t *piVar20;
  int8_t *piVar21;
  int8_t *piVar22;
  int8_t *piVar23;
  TX_TYPE tx_type;
  int iVar24;
  int iVar25;
  long lVar26;
  int bit;
  TX_SIZE tx_size;
  transform_1d_sse4_1 p_Var27;
  int iVar28;
  __m128i *palVar29;
  __m128i *palVar30;
  undefined8 local_238;
  undefined4 auStack_230 [14];
  longlong local_1f8 [6];
  longlong local_1c8 [18];
  __m128i buf1 [16];
  
  piVar23 = av1_inv_txfm_shift_ls[0xe];
  piVar22 = av1_inv_txfm_shift_ls[0xd];
  piVar21 = av1_inv_txfm_shift_ls[6];
  piVar20 = av1_inv_txfm_shift_ls[5];
  tx_size = txfm_param->tx_size;
  switch(tx_size) {
  case '\0':
    if (txfm_param->lossless == 0) {
      av1_inv_txfm2d_add_4x4_sse4_1
                (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
      return;
    }
    av1_highbd_iwht4x4_add(input,dest,stride,txfm_param->eob,txfm_param->bd);
    return;
  case '\x01':
    iVar24 = txfm_param->bd;
    tx_type = txfm_param->tx_type;
    if (6 < (byte)(tx_type - 9)) {
      av1_inv_txfm2d_add_8x8_sse4_1(input,(uint16_t *)((long)dest * 2),stride,tx_type,iVar24);
      return;
    }
    iVar28 = txfm_param->eob;
    tx_size = '\x01';
    break;
  default:
    tx_type = txfm_param->tx_type;
    iVar24 = txfm_param->bd;
    iVar28 = txfm_param->eob;
    break;
  case '\x05':
    iVar28 = txfm_param->bd;
    bVar1 = txfm_param->tx_type;
    iVar24 = 0;
    p_Var2 = highbd_txfm_all_1d_zeros_w8_arr[0][""[bVar1]][0];
    bVar4 = true;
    if (bVar1 < 0x10) {
      if ((0x4110U >> (bVar1 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (bVar1 & 0x1f) & 1) == 0) {
          if (bVar1 != 6) goto LAB_00383fad;
          iVar24 = 1;
        }
        else {
          iVar24 = 0;
        }
        bVar4 = false;
      }
      else {
        iVar24 = 1;
      }
    }
LAB_00383fad:
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[1][""[bVar1]][1];
    bit = 4;
    iVar25 = iVar24;
    load_buffer_32bit_input(input,8,(__m128i *)&local_238,4);
    palVar30 = (__m128i *)local_1f8;
    load_buffer_32bit_input(input + 4,8,palVar30,4);
    av1_round_shift_rect_array_32_sse4_1((__m128i *)&local_238,(__m128i *)&local_238,8,bit,iVar25);
    (*p_Var2)((__m128i *)&local_238,(__m128i *)&local_238,0xc,0,iVar28,-(int)*piVar20);
    (*p_Var2)(palVar30,palVar30,0xc,0,iVar28,-(int)*piVar20);
    buf1[3][0]._0_4_ = auStack_230[0xd];
    buf1[3][0]._4_4_ = auStack_230[9];
    buf1[1][0]._0_4_ = auStack_230[0xb];
    buf1[1][0]._4_4_ = auStack_230[7];
    buf1[0][0]._0_4_ = auStack_230[10];
    buf1[0][0]._4_4_ = auStack_230[6];
    buf1[2][0]._0_4_ = auStack_230[0xc];
    buf1[2][0]._4_4_ = auStack_230[8];
    if (bVar4) {
      palVar30 = (__m128i *)local_1c8;
      buf1[3][0]._0_4_ = auStack_230[1];
      buf1[3][0]._4_4_ = auStack_230[5];
      auStack_230[5] = auStack_230[9];
      auStack_230[1] = auStack_230[0xd];
      buf1[1][0]._0_4_ = local_238._4_4_;
      buf1[1][0]._4_4_ = auStack_230[3];
      auStack_230[3] = auStack_230[7];
      local_238._4_4_ = auStack_230[0xb];
      buf1[0][0]._0_4_ = (undefined4)local_238;
      buf1[0][0]._4_4_ = auStack_230[2];
      auStack_230[2] = auStack_230[6];
      local_238._0_4_ = auStack_230[10];
      buf1[2][0]._0_4_ = auStack_230[0];
      buf1[2][0]._4_4_ = auStack_230[4];
      auStack_230[4] = auStack_230[8];
      auStack_230[0] = auStack_230[0xc];
    }
    buf1[0][1]._0_4_ = auStack_230[2];
    buf1[0][1]._4_4_ = (undefined4)local_238;
    buf1[1][1]._0_4_ = auStack_230[3];
    buf1[1][1]._4_4_ = local_238._4_4_;
    buf1[2][1]._0_4_ = auStack_230[4];
    buf1[2][1]._4_4_ = auStack_230[0];
    buf1[3][1]._0_4_ = auStack_230[5];
    buf1[3][1]._4_4_ = auStack_230[1];
    buf1[4][1]._4_4_ = (undefined4)(*palVar30)[0];
    buf1[5][1]._4_4_ = *(undefined4 *)((long)*palVar30 + 4);
    buf1[6][1]._4_4_ = (undefined4)(*palVar30)[1];
    buf1[7][1]._4_4_ = *(undefined4 *)((long)*palVar30 + 0xc);
    (*p_Var3)(buf1,buf1,0xc,1,iVar28,0);
    iVar25 = 8;
    av1_round_shift_array_32_sse4_1(buf1,buf1,8,-(int)piVar20[1]);
LAB_00384562:
    highbd_write_buffer_4xn_sse4_1(buf1,(uint16_t *)((long)dest * 2),stride,iVar24,iVar25,iVar28);
    return;
  case '\x06':
    iVar24 = txfm_param->bd;
    bVar1 = txfm_param->tx_type;
    iVar28 = 0;
    p_Var2 = highbd_txfm_all_1d_zeros_w8_arr[1][""[bVar1]][1];
    bVar4 = true;
    if (bVar1 < 0x10) {
      if ((0x4110U >> (bVar1 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (bVar1 & 0x1f) & 1) == 0) {
          if (bVar1 != 6) goto LAB_003842ad;
          iVar28 = 1;
        }
        else {
          iVar28 = 0;
        }
        bVar4 = false;
      }
      else {
        iVar28 = 1;
      }
    }
LAB_003842ad:
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[0][""[bVar1]][0];
    palVar30 = (__m128i *)&local_238;
    iVar25 = 8;
    p_Var27 = p_Var2;
    load_buffer_32bit_input(input,4,palVar30,8);
    av1_round_shift_rect_array_32_sse4_1(palVar30,palVar30,8,iVar25,(int)p_Var27);
    (*p_Var2)(palVar30,palVar30,0xc,0,iVar24,-(int)*piVar21);
    if (!bVar4) {
      palVar30 = buf1;
      flip_buf_sse2((__m128i *)&local_238,palVar30,8);
    }
    for (lVar26 = 0; lVar26 != 0x80; lVar26 = lVar26 + 0x40) {
      palVar29 = (__m128i *)((long)*palVar30 + lVar26);
      transpose_32bit_4x4(palVar29,palVar29);
      (*p_Var3)(palVar29,palVar29,0xc,1,iVar24,0);
    }
    av1_round_shift_array_32_sse4_1(palVar30,palVar30,8,-(int)piVar21[1]);
    highbd_write_buffer_8xn_sse4_1(palVar30,(uint16_t *)((long)dest * 2),stride,iVar28,4,iVar24);
    return;
  case '\r':
    bVar1 = txfm_param->tx_type;
    iVar24 = 0;
    bVar4 = true;
    if (bVar1 < 0x10) {
      if ((0x4110U >> (bVar1 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (bVar1 & 0x1f) & 1) == 0) {
          if (bVar1 != 6) goto LAB_003843a6;
          iVar24 = 1;
        }
        else {
          iVar24 = 0;
        }
        bVar4 = false;
      }
      else {
        iVar24 = 1;
      }
    }
LAB_003843a6:
    iVar28 = txfm_param->bd;
    p_Var2 = highbd_txfm_all_1d_zeros_w8_arr[0][""[bVar1]][0];
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[2][""[bVar1]][2];
    for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 0x40) {
      palVar30 = (__m128i *)((long)&local_238 + lVar26);
      load_buffer_32bit_input(input,0x10,palVar30,4);
      (*p_Var2)(palVar30,palVar30,0xc,0,iVar28,-(int)*piVar22);
      input = input + 4;
    }
    if (bVar4) {
      for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 0x40) {
        uVar5 = *(undefined4 *)((long)auStack_230 + lVar26 + -4);
        uVar6 = *(undefined4 *)((long)auStack_230 + lVar26);
        uVar7 = *(undefined4 *)((long)auStack_230 + lVar26 + 4);
        uVar8 = *(undefined4 *)((long)auStack_230 + lVar26 + 8);
        uVar9 = *(undefined4 *)((long)auStack_230 + lVar26 + 0xc);
        uVar10 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x10);
        uVar11 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x14);
        uVar12 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x18);
        uVar13 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x1c);
        uVar14 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x20);
        uVar15 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x24);
        uVar16 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x28);
        uVar17 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x2c);
        uVar18 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x30);
        uVar19 = *(undefined4 *)((long)local_1f8 + lVar26 + -4);
        *(undefined4 *)((long)buf1[0] + lVar26) = *(undefined4 *)((long)&local_238 + lVar26);
        *(undefined4 *)((long)buf1[0] + lVar26 + 4) = uVar8;
        *(undefined4 *)((long)buf1[0] + lVar26 + 8) = uVar12;
        *(undefined4 *)((long)buf1[0] + lVar26 + 0xc) = uVar16;
        *(undefined4 *)((long)buf1[1] + lVar26) = uVar5;
        *(undefined4 *)((long)buf1[1] + lVar26 + 4) = uVar9;
        *(undefined4 *)((long)buf1[1] + lVar26 + 8) = uVar13;
        *(undefined4 *)((long)buf1[1] + lVar26 + 0xc) = uVar17;
        *(undefined4 *)((long)buf1[2] + lVar26) = uVar6;
        *(undefined4 *)((long)buf1[2] + lVar26 + 4) = uVar10;
        *(undefined4 *)((long)buf1[2] + lVar26 + 8) = uVar14;
        *(undefined4 *)((long)buf1[2] + lVar26 + 0xc) = uVar18;
        *(undefined4 *)((long)buf1[3] + lVar26) = uVar7;
        *(undefined4 *)((long)buf1[3] + lVar26 + 4) = uVar11;
        *(undefined4 *)((long)buf1[3] + lVar26 + 8) = uVar15;
        *(undefined4 *)((long)buf1[3] + lVar26 + 0xc) = uVar19;
      }
    }
    else {
      for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 0x40) {
        uVar5 = *(undefined4 *)((long)&local_238 + lVar26);
        uVar6 = *(undefined4 *)((long)auStack_230 + lVar26 + -4);
        uVar7 = *(undefined4 *)((long)auStack_230 + lVar26);
        uVar8 = *(undefined4 *)((long)auStack_230 + lVar26 + 4);
        uVar9 = *(undefined4 *)((long)auStack_230 + lVar26 + 8);
        uVar10 = *(undefined4 *)((long)auStack_230 + lVar26 + 0xc);
        uVar11 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x10);
        uVar12 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x14);
        uVar13 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x18);
        uVar14 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x1c);
        uVar15 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x20);
        uVar16 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x24);
        uVar17 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x2c);
        uVar18 = *(undefined4 *)((long)auStack_230 + lVar26 + 0x30);
        uVar19 = *(undefined4 *)((long)local_1f8 + lVar26 + -4);
        *(undefined4 *)((long)buf1[0] + lVar26) = *(undefined4 *)((long)auStack_230 + lVar26 + 0x28)
        ;
        *(undefined4 *)((long)buf1[0] + lVar26 + 4) = uVar13;
        *(undefined4 *)((long)buf1[0] + lVar26 + 8) = uVar9;
        *(undefined4 *)((long)buf1[0] + lVar26 + 0xc) = uVar5;
        *(undefined4 *)((long)buf1[1] + lVar26) = uVar17;
        *(undefined4 *)((long)buf1[1] + lVar26 + 4) = uVar14;
        *(undefined4 *)((long)buf1[1] + lVar26 + 8) = uVar10;
        *(undefined4 *)((long)buf1[1] + lVar26 + 0xc) = uVar6;
        *(undefined4 *)((long)buf1[2] + lVar26) = uVar18;
        *(undefined4 *)((long)buf1[2] + lVar26 + 4) = uVar15;
        *(undefined4 *)((long)buf1[2] + lVar26 + 8) = uVar11;
        *(undefined4 *)((long)buf1[2] + lVar26 + 0xc) = uVar7;
        *(undefined4 *)((long)buf1[3] + lVar26) = uVar19;
        *(undefined4 *)((long)buf1[3] + lVar26 + 4) = uVar16;
        *(undefined4 *)((long)buf1[3] + lVar26 + 8) = uVar12;
        *(undefined4 *)((long)buf1[3] + lVar26 + 0xc) = uVar8;
      }
    }
    (*p_Var3)(buf1,buf1,0xc,1,iVar28,0);
    iVar25 = 0x10;
    av1_round_shift_array_32_sse4_1(buf1,buf1,0x10,-(int)piVar22[1]);
    goto LAB_00384562;
  case '\x0e':
    iVar24 = txfm_param->bd;
    bVar1 = txfm_param->tx_type;
    iVar28 = 0;
    p_Var2 = highbd_txfm_all_1d_zeros_w8_arr[2][""[bVar1]][2];
    bVar4 = true;
    if (bVar1 < 0x10) {
      if ((0x4110U >> (bVar1 & 0x1f) & 1) == 0) {
        if ((0x80a0U >> (bVar1 & 0x1f) & 1) == 0) {
          if (bVar1 != 6) goto LAB_003841ab;
          iVar28 = 1;
        }
        else {
          iVar28 = 0;
        }
        bVar4 = false;
      }
      else {
        iVar28 = 1;
      }
    }
LAB_003841ab:
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[0][""[bVar1]][0];
    palVar30 = (__m128i *)&local_238;
    load_buffer_32bit_input(input,4,palVar30,0x10);
    (*p_Var2)(palVar30,palVar30,0xc,0,iVar24,-(int)*piVar23);
    if (!bVar4) {
      palVar30 = buf1;
      flip_buf_sse2((__m128i *)&local_238,palVar30,0x10);
    }
    for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 0x40) {
      palVar29 = (__m128i *)((long)*palVar30 + lVar26);
      transpose_32bit_4x4(palVar29,palVar29);
      (*p_Var3)(palVar29,palVar29,0xc,1,iVar24,0);
    }
    av1_round_shift_array_32_sse4_1(palVar30,palVar30,0x10,-(int)piVar23[1]);
    for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 0x10) {
      highbd_write_buffer_8xn_sse4_1
                (palVar30,(uint16_t *)((long)dest * 2 + lVar26),stride,iVar28,4,iVar24);
      palVar30 = palVar30 + 8;
    }
    return;
  }
  av1_highbd_inv_txfm2d_add_universe_sse4_1(input,dest,stride,tx_type,tx_size,iVar28,iVar24);
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_sse4_1(const tran_low_t *input, uint8_t *dest,
                                    int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_8X8:
      av1_highbd_inv_txfm_add_8x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      av1_highbd_inv_txfm_add_4x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      av1_highbd_inv_txfm_add_8x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      av1_highbd_inv_txfm_add_4x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      av1_highbd_inv_txfm_add_16x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      av1_highbd_inv_txfm_add_4x16_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(
          input, dest, stride, txfm_param->tx_type, tx_size, txfm_param->eob,
          txfm_param->bd);
      break;
  }
}